

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseSelect(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  uint uVar3;
  Node *node;
  TidyParserMemory memory;
  Node *pNStack_48;
  
  pLVar1 = doc->lexer;
  if (field == (Node *)0x0) {
    prvTidypopMemory(doc);
    field = pNStack_48;
  }
  pLVar1->insert = (IStack *)0x0;
  while( true ) {
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) {
      prvTidyReport(doc,field,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if ((node->tag == field->tag) && (node->type == EndTag)) break;
    BVar2 = InsertMisc(field,node);
    if (BVar2 == no) {
      if ((((node->type == StartTag) && (node->tag != (Dict *)0x0)) &&
          (uVar3 = node->tag->id - TidyTag_OPTGROUP, uVar3 < 0x35)) &&
         ((0x10000000010003U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        prvTidyInsertNodeAtEnd(field,node);
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT2448(CONCAT816(node,CONCAT88(field,prvTidyParseSelect))));
        return node;
      }
      prvTidyReport(doc,field,node,0x235);
      prvTidyFreeNode(doc,node);
    }
  }
  prvTidyFreeNode(doc,node);
  field->closed = yes;
  TrimSpaces(doc,field);
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseSelect)( TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;

    if ( field == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        field = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(field);
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag &&
             ( nodeIsOPTION(node)   ||
               nodeIsOPTGROUP(node) ||
               nodeIsDATALIST(node) ||
               nodeIsSCRIPT(node))
           )
        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseSelect);
            memory.original_node = field;
            memory.reentry_node = node;

            TY_(InsertNodeAtEnd)(field, node);
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);

    DEBUG_LOG_EXIT;
    return NULL;
}